

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getHullVolume(Thermo *this)

{
  return 0.0;
}

Assistant:

RealType Thermo::getHullVolume() {
#ifdef HAVE_QHULL
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    if (!snap->hasHullVolume) {
      Hull* surfaceMesh_;

      Globals* simParams   = info_->getSimParams();
      const std::string ht = simParams->getHULL_Method();

      if (ht == "Convex") {
        surfaceMesh_ = new ConvexHull();
      } else if (ht == "AlphaShape") {
        surfaceMesh_ = new AlphaHull(simParams->getAlpha());
      } else {
        return 0.0;
      }

      // Build a vector of stunt doubles to determine if they are
      // surface atoms
      std::vector<StuntDouble*> localSites_;
      Molecule* mol;
      StuntDouble* sd;
      SimInfo::MoleculeIterator i;
      Molecule::IntegrableObjectIterator j;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          localSites_.push_back(sd);
        }
      }

      // Compute surface Mesh
      surfaceMesh_->computeHull(localSites_);
      snap->setHullVolume(surfaceMesh_->getVolume());

      delete surfaceMesh_;
    }

    return snap->getHullVolume();
#else
    return 0.0;
#endif
  }